

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
CEPlanet::PositionICRS_Obs(CEPlanet *this,CEDate *date)

{
  long *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  CEPlanet *this_00;
  CEDate *in_stack_00000018;
  CEPlanet *in_stack_00000020;
  double delay;
  double earth_dist;
  CEPlanet past;
  CEPlanet *in_stack_fffffffffffffe38;
  CEPlanet *in_stack_fffffffffffffe40;
  CEPlanet *in_stack_fffffffffffffe98;
  CEPlanet *in_stack_fffffffffffffea0;
  
  CEPlanet(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  CEDate::operator_cast_to_double((CEDate *)0x13d61b);
  UpdatePosition(in_stack_fffffffffffffe40,(double *)in_stack_fffffffffffffe38);
  EarthDist_AU(in_stack_00000020,in_stack_00000018);
  CppEphem::c_au_per_day();
  this_00 = (CEPlanet *)(**(code **)(*in_RDX + 0x20))();
  UpdatePosition(this_00,(double *)in_stack_fffffffffffffe38);
  PositionICRS(in_stack_fffffffffffffe38);
  ~CEPlanet(this_00);
  return in_RDI;
}

Assistant:

std::vector<double> CEPlanet::PositionICRS_Obs(const CEDate& date) const
{
    // Make a copy of the planet so we dont need to reset values
    CEPlanet past(*this);
    past.UpdatePosition(date);

    // Compute the light travel-time delay
    double earth_dist = past.EarthDist_AU(date);
    double delay      = earth_dist / CppEphem::c_au_per_day();

    // Return the positions as observed
    past.UpdatePosition(date.JD() - delay);
    return past.PositionICRS();
}